

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O2

void olsrv2_lan_remove(nhdp_domain *domain,os_route_key *prefix)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = avl_find(&_lan_tree);
  if (lVar2 != 0) {
    *(undefined1 *)(lVar2 + 0x41 + (long)domain->index * 8) = 0;
    olsrv2_routing_domain_changed(domain,true);
    lVar3 = 0;
    do {
      if (lVar3 == 4) {
        _remove((char *)(lVar2 + -0x28));
        return;
      }
      lVar1 = lVar3 * 8;
      lVar3 = lVar3 + 1;
    } while (*(char *)(lVar2 + 0x41 + lVar1) == '\0');
  }
  return;
}

Assistant:

void
olsrv2_lan_remove(struct nhdp_domain *domain, const struct os_route_key *prefix) {
  struct olsrv2_lan_entry *entry;
  struct olsrv2_lan_domaindata *lan_data;
  int i;

  entry = olsrv2_lan_get(prefix);
  if (!entry) {
    return;
  }

  lan_data = olsrv2_lan_get_domaindata(domain, entry);
  lan_data->active = false;
  olsrv2_routing_domain_changed(domain, true);

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    if (entry->_domaindata[i].active) {
      /* entry is still in use */
      return;
    }
  }
  _remove(entry);
}